

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::internal::LegacyTraceId::Write
          (LegacyTraceId *this,LegacyEvent *event,uint32_t event_flags)

{
  byte bVar1;
  char *__s;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  byte *pbVar5;
  long lVar6;
  uint32_t field_id;
  unsigned_long value;
  ulong value_00;
  unsigned_long local_48;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  uVar2 = Track::process_uuid;
  if ((event_flags & 0x180) != 0) {
    value_00 = *(ulong *)(this + 0x18);
    if ((*(uint *)(this + 0x20) >> 0xb & 1) != 0) {
      if (Platform::process_id_ == 0) {
        getpid();
      }
      value_00 = uVar2 ^ value_00;
    }
    protozero::Message::AppendVarInt<unsigned_long>(&event->super_Message,8,value_00);
    return;
  }
  uVar3 = *(uint *)(this + 0x20) & 0x1802;
  pbVar5 = *(byte **)this;
  value = *(unsigned_long *)(this + 0x18);
  if (uVar3 != 0x1000 && pbVar5 != (byte *)0x0) {
    local_48 = value;
    value = 0xcbf29ce484222325;
    lVar6 = 0;
    do {
      value = (value ^ *(byte *)((long)&local_48 + lVar6)) * 0x100000001b3;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    bVar1 = *pbVar5;
    while (bVar1 != 0) {
      pbVar5 = pbVar5 + 1;
      value = (bVar1 ^ value) * 0x100000001b3;
      bVar1 = *pbVar5;
    }
  }
  if (uVar3 == 2) {
    field_id = 6;
  }
  else if (uVar3 == 0x1000) {
    field_id = 0xb;
  }
  else {
    if (uVar3 != 0x800) goto LAB_002ac67e;
    field_id = 10;
  }
  protozero::Message::AppendVarInt<unsigned_long>(&event->super_Message,field_id,value);
LAB_002ac67e:
  __s = *(char **)this;
  if (__s != (char *)0x0) {
    local_40 = local_30;
    sVar4 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,__s,__s + sVar4);
    protozero::Message::AppendBytes(&event->super_Message,7,local_40,local_38);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return;
}

Assistant:

void LegacyTraceId::Write(protos::pbzero::TrackEvent::LegacyEvent* event,
                          uint32_t event_flags) const {
  // Legacy flow events always use bind_id.
  if (event_flags &
      (legacy::kTraceEventFlagFlowOut | legacy::kTraceEventFlagFlowIn)) {
    // Flow bind_ids don't have scopes, so we need to mangle in-process ones to
    // avoid collisions.
    if (id_flags_ & legacy::kTraceEventFlagHasLocalId) {
      event->set_bind_id(raw_id_ ^ ProcessTrack::Current().uuid);
    } else {
      event->set_bind_id(raw_id_);
    }
    return;
  }

  uint32_t scope_flags = id_flags_ & (legacy::kTraceEventFlagHasId |
                                      legacy::kTraceEventFlagHasLocalId |
                                      legacy::kTraceEventFlagHasGlobalId);
  uint64_t id = raw_id_;
  if (scope_ && scope_flags != legacy::kTraceEventFlagHasGlobalId) {
    id = base::Hash::Combine(id, scope_);
  }

  switch (scope_flags) {
    case legacy::kTraceEventFlagHasId:
      event->set_unscoped_id(id);
      break;
    case legacy::kTraceEventFlagHasLocalId:
      event->set_local_id(id);
      break;
    case legacy::kTraceEventFlagHasGlobalId:
      event->set_global_id(id);
      break;
  }
  if (scope_)
    event->set_id_scope(scope_);
}